

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrLocateViews(XrSession session,XrViewLocateInfo *viewLocateInfo,XrViewState *viewState,
                      uint32_t viewCapacityInput,uint32_t *viewCountOutput,XrView *views)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_4c;
  LoaderInstance *pLStack_48;
  XrResult result;
  LoaderInstance *loader_instance;
  XrView *views_local;
  uint32_t *viewCountOutput_local;
  XrViewState *pXStack_28;
  uint32_t viewCapacityInput_local;
  XrViewState *viewState_local;
  XrViewLocateInfo *viewLocateInfo_local;
  XrSession session_local;
  
  loader_instance = (LoaderInstance *)views;
  views_local = (XrView *)viewCountOutput;
  viewCountOutput_local._4_4_ = viewCapacityInput;
  pXStack_28 = viewState;
  viewState_local = (XrViewState *)viewLocateInfo;
  viewLocateInfo_local = (XrViewLocateInfo *)session;
  local_4c = ActiveLoaderInstance::Get(&stack0xffffffffffffffb8,"xrLocateViews");
  if (XR_ERROR_VALIDATION_FAILURE < local_4c) {
    this = LoaderInstance::DispatchTable(pLStack_48);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_4c = (*pXVar1->LocateViews)
                         ((XrSession)viewLocateInfo_local,(XrViewLocateInfo *)viewState_local,
                          pXStack_28,viewCountOutput_local._4_4_,&views_local->type,
                          (XrView *)loader_instance);
  }
  return local_4c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrLocateViews(
    XrSession                                   session,
    const XrViewLocateInfo*                     viewLocateInfo,
    XrViewState*                                viewState,
    uint32_t                                    viewCapacityInput,
    uint32_t*                                   viewCountOutput,
    XrView*                                     views) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrLocateViews");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->LocateViews(session, viewLocateInfo, viewState, viewCapacityInput, viewCountOutput, views);
    }
    return result;
}